

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
::~Node(Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *this)

{
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_001c89f0;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::~vector(&this->children);
  TestGroupStats::~TestGroupStats(&this->value);
  return;
}

Assistant:

virtual ~Node() {}